

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

App * __thiscall CLI::App::immediate_callback(App *this,bool immediate)

{
  _Manager_type p_Var1;
  _Manager_type p_Var2;
  undefined7 in_register_00000031;
  
  this->immediate_callback_ = immediate;
  p_Var1 = (this->parse_complete_callback_).super__Function_base._M_manager;
  p_Var2 = (this->final_callback_).super__Function_base._M_manager;
  if ((int)CONCAT71(in_register_00000031,immediate) == 0) {
    if (p_Var2 != (_Manager_type)0x0 || p_Var1 == (_Manager_type)0x0) {
      return this;
    }
  }
  else if (p_Var2 == (_Manager_type)0x0 || p_Var1 != (_Manager_type)0x0) {
    return this;
  }
  std::function<void_()>::swap(&this->final_callback_,&this->parse_complete_callback_);
  return this;
}

Assistant:

CLI11_INLINE App *App::immediate_callback(bool immediate) {
    immediate_callback_ = immediate;
    if(immediate_callback_) {
        if(final_callback_ && !(parse_complete_callback_)) {
            std::swap(final_callback_, parse_complete_callback_);
        }
    } else if(!(final_callback_) && parse_complete_callback_) {
        std::swap(final_callback_, parse_complete_callback_);
    }
    return this;
}